

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

void base64_stream_encode_final(base64_state *state,char *out,size_t *outlen)

{
  uint8_t *o;
  char *pcVar1;
  size_t sStack_8;
  
  if (state->bytes == 2) {
    *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[state->carry];
    pcVar1 = out + 1;
    sStack_8 = 2;
  }
  else {
    if (state->bytes != 1) {
      sStack_8 = 0;
      goto LAB_00102b49;
    }
    *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[state->carry];
    out[1] = '=';
    pcVar1 = out + 2;
    sStack_8 = 3;
  }
  *pcVar1 = '=';
LAB_00102b49:
  *outlen = sStack_8;
  return;
}

Assistant:

void
base64_stream_encode_final
	( struct base64_state	*state
	, char			*out
	, size_t		*outlen
	)
{
	uint8_t *o = (uint8_t *)out;

	if (state->bytes == 1) {
		*o++ = base64_table_enc_6bit[state->carry];
		*o++ = '=';
		*o++ = '=';
		*outlen = 3;
		return;
	}
	if (state->bytes == 2) {
		*o++ = base64_table_enc_6bit[state->carry];
		*o++ = '=';
		*outlen = 2;
		return;
	}
	*outlen = 0;
}